

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdStoreWord(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Reg reg;
  x86Reg reg1;
  uint uVar1;
  uint shift;
  
  uVar1 = cmd._3_4_ & 0xff;
  shift = (uint)((ulong)cmd >> 5) & 0x7f8;
  reg = CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sDWORD,rNONE,1,rEBX,shift,true);
  if (reg == rRegCount) {
    reg = CodeGenGenericContext::GetReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,reg,sDWORD,rEBX,shift);
  }
  else {
    CodeGenGenericContext::LockReg(&ctx->ctx,reg);
  }
  if (uVar1 == 1) {
    reg1 = rR15;
  }
  else {
    uVar1 = uVar1 << 3;
    reg1 = CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rEBX,uVar1,true);
    if (reg1 == rRegCount) {
      reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,reg1,sQWORD,rEBX,uVar1);
    }
  }
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sWORD,reg1,cmd.argument,reg);
  return;
}

Assistant:

void GenCodeCmdStoreWord(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	x86Reg temp = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, cmd.rA * 8, true);

	if(temp == rRegCount)
	{
		temp = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, temp, sDWORD, rREG, cmd.rA * 8); // Load value
	}
	else
	{
		ctx.ctx.LockReg(temp);
	}

	if(cmd.rC == rvrrFrame)
	{
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sWORD, rR15, cmd.argument, temp); // Store short value
	}
	else
	{
		x86Reg address = ctx.ctx.FindRegAtMemory(sQWORD, rNONE, 1, rREG, cmd.rC * 8, true);

		if(address == rRegCount)
		{
			address = ctx.ctx.GetReg();

			EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, address, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		}

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sWORD, address, cmd.argument, temp); // Store value to target with an offset
	}
#else
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rA * 8); // Load value

	x86GenCodeStoreInt16ToPointer(ctx, rEAX, rEDX, cmd.rC, cmd.argument);
#endif
}